

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O3

void wstran_connect_cb(void *arg)

{
  nni_aio *aio;
  nni_mtx *mtx;
  nng_err nVar1;
  int iVar2;
  nni_aio *aio_00;
  void *local_40;
  ws_pipe *p;
  
  aio = (nni_aio *)((long)arg + 0x48);
  mtx = (nni_mtx *)((long)arg + 0x20);
  nni_mtx_lock(mtx);
  nVar1 = nni_aio_result(aio);
  if (nVar1 == NNG_OK) {
    p = (ws_pipe *)nni_aio_get_output(aio,0);
  }
  else {
    p = (ws_pipe *)0x0;
  }
  aio_00 = (nni_aio *)nni_list_first((nni_list *)((long)arg + 8));
  if (aio_00 == (nni_aio *)0x0) {
    nng_stream_free((nng_stream *)p);
    nni_mtx_unlock(mtx);
    return;
  }
  nni_aio_list_remove(aio_00);
  iVar2 = nni_list_empty((nni_list *)((long)arg + 8));
  if (iVar2 == 0) {
    nni_panic("%s: %d: assert err: %s",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ws/websocket.c"
              ,0x192,"nni_list_empty(&d->aios)");
  }
  nVar1 = nni_aio_result(aio);
  if (nVar1 == NNG_OK) {
    nVar1 = nni_pipe_alloc_dialer(&local_40,*(nni_dialer **)((long)arg + 0x218));
    if (nVar1 == NNG_OK) {
      *(undefined2 *)((long)local_40 + 0x2a) = *arg;
      *(ws_pipe **)((long)local_40 + 0x3d0) = p;
      nni_aio_set_output(aio_00,0,*(void **)((long)local_40 + 0x3d8));
      nni_aio_finish(aio_00,NNG_OK,0);
      goto LAB_0012fdb1;
    }
    nng_stream_free((nng_stream *)p);
  }
  nni_aio_finish_error(aio_00,nVar1);
LAB_0012fdb1:
  nni_mtx_unlock(mtx);
  return;
}

Assistant:

static void
wstran_connect_cb(void *arg)
{
	ws_dialer  *d = arg;
	ws_pipe    *p;
	nni_aio    *caio = &d->connaio;
	nni_aio    *uaio;
	int         rv;
	nng_stream *ws = NULL;

	nni_mtx_lock(&d->mtx);
	if (nni_aio_result(caio) == 0) {
		ws = nni_aio_get_output(caio, 0);
	}
	if ((uaio = nni_list_first(&d->aios)) == NULL) {
		// The client stopped caring about this!
		nng_stream_free(ws);
		nni_mtx_unlock(&d->mtx);
		return;
	}
	nni_aio_list_remove(uaio);
	NNI_ASSERT(nni_list_empty(&d->aios));
	if ((rv = nni_aio_result(caio)) != 0) {
		nni_aio_finish_error(uaio, rv);
	} else if ((rv = nni_pipe_alloc_dialer((void **) &p, d->ndialer)) !=
	    0) {
		nng_stream_free(ws);
		nni_aio_finish_error(uaio, rv);
	} else {
		p->peer = d->peer;
		p->ws   = ws;

		nni_aio_set_output(uaio, 0, p->npipe);
		nni_aio_finish(uaio, 0, 0);
	}
	nni_mtx_unlock(&d->mtx);
}